

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

void __thiscall GF2::BFunc<7UL>::FWHT(BFunc<7UL> *this,Func<7UL,_int> *zfRight)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  word i;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  Preimage x;
  
  x._words[0] = (word  [1])0;
  do {
    zfRight->_vals[(long)x._words[0]] =
         (this->super_Func<7UL,_bool>)._vals[(long)x._words[0]] - 1 | 1;
    bVar3 = WW<7UL>::Next(&x,false);
  } while (bVar3);
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    lVar5 = 1L << ((byte)lVar4 & 0x3f);
    lVar6 = 2L << ((byte)lVar4 & 0x3f);
    uVar8 = 0;
    piVar7 = zfRight->_vals;
    for (; piVar9 = piVar7, lVar10 = lVar5, uVar8 < 0x80; uVar8 = uVar8 + lVar6) {
      while (bVar3 = lVar10 != 0, lVar10 = lVar10 + -1, bVar3) {
        iVar1 = *piVar9;
        iVar2 = piVar9[lVar5];
        *piVar9 = iVar2 + iVar1;
        piVar9[lVar5] = iVar1 - iVar2;
        piVar9 = piVar9 + 1;
      }
      piVar7 = piVar7 + lVar6;
    }
  }
  return;
}

Assistant:

void FWHT(Func<_n, int>& zfRight) const
	{	
		Preimage x;
		// zfRight <- (-1)^this
		do 
			zfRight[x] = Get(x) ? 1 : -1;
		while (x.Next());
		// zf <- FWHT(zf)
		for (word i = 0; i < _n; ++i)
		for (word j = 0; j < _size; j += WORD_1 << (i + 1))
		for (word k = 0; k < WORD_1 << i; ++k)
		{
			int t = zfRight[j + k];
			zfRight[j + k] += zfRight[j + k + (WORD_1 << i)];
			zfRight[j + k + (WORD_1 << i)] = 
				t - zfRight[j + k + (WORD_1 << i)];
		}
	}